

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnet_unix_p.h
# Opt level: O0

int qt_safe_connect(int sockfd,sockaddr *addr,socklen_t addrlen)

{
  int iVar1;
  int *piVar2;
  socklen_t in_EDX;
  sockaddr *in_RSI;
  int in_EDI;
  bool bVar3;
  int ret;
  
  do {
    iVar1 = connect(in_EDI,in_RSI,in_EDX);
    bVar3 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  return iVar1;
}

Assistant:

static inline int qt_safe_connect(int sockfd, const struct sockaddr *addr, QT_SOCKLEN_T addrlen)
{
    int ret;
    // Solaris e.g. expects a non-const 2nd parameter
    QT_EINTR_LOOP(ret, QT_SOCKET_CONNECT(sockfd, const_cast<struct sockaddr *>(addr), addrlen));
#ifdef Q_OS_WASM
// ::connect on wasm returns 0 when it shouldn't so use errno instead
   if (errno != 0)
       ret = -1;
#endif
    return ret;
}